

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void GenerateRandomFloat(float *data,size_t num)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  size_t sVar5;
  undefined1 auVar6 [64];
  mt19937 e;
  random_device rd;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2730;
  random_device local_13a8;
  undefined1 extraout_var [56];
  
  std::random_device::random_device(&local_13a8);
  uVar2 = std::random_device::_M_getval();
  local_2730._M_x[0] = (unsigned_long)uVar2;
  lVar4 = 1;
  uVar3 = local_2730._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
    local_2730._M_x[lVar4] = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_2730._M_p = 0x270;
  if (num != 0) {
    sVar5 = 0;
    do {
      auVar6._0_8_ = std::
                     generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                               (&local_2730);
      auVar6._8_56_ = extraout_var;
      auVar1 = vfmadd213sd_fma(auVar6._0_16_,ZEXT816(0x4024000000000000),ZEXT816(0));
      data[sVar5] = (float)auVar1._0_8_;
      sVar5 = sVar5 + 1;
    } while (num != sVar5);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void GenerateRandomFloat(float *data, size_t num) {
  std::random_device rd;
  std::mt19937 e(rd());
  std::uniform_real_distribution<> dist(0, 10);

  for (size_t i = 0; i < num; i++) {
    data[i] = dist(e);
  }
}